

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::val::ValidationState_t::GetDimension(ValidationState_t *this,uint32_t id)

{
  ushort uVar1;
  long *plVar2;
  uint32_t uVar3;
  const_iterator cVar4;
  uint32_t local_c;
  
  local_c = id;
  cVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_c);
  if ((cVar4.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (plVar2 = *(long **)((long)cVar4.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                ._M_cur + 0x10), plVar2 == (long *)0x0)) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x382,"uint32_t spvtools::val::ValidationState_t::GetDimension(uint32_t) const");
  }
  uVar1 = *(ushort *)((long)plVar2 + 0x3a);
  if (uVar1 < 0x17) {
    if (uVar1 - 0x14 < 3) {
      return 1;
    }
  }
  else {
    if (uVar1 - 0x17 < 2) {
      return *(uint32_t *)(*plVar2 + 0xc);
    }
    if ((uVar1 == 0x1168) || (uVar1 == 0x14ee)) {
      return 0;
    }
  }
  if (*(uint32_t *)(plVar2 + 8) != 0) {
    uVar3 = GetDimension(this,*(uint32_t *)(plVar2 + 8));
    return uVar3;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                ,0x399,"uint32_t spvtools::val::ValidationState_t::GetDimension(uint32_t) const");
}

Assistant:

uint32_t ValidationState_t::GetDimension(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  assert(inst);

  switch (inst->opcode()) {
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeBool:
      return 1;

    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
      return inst->word(3);

    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      // Actual dimension isn't known, return 0
      return 0;

    default:
      break;
  }

  if (inst->type_id()) return GetDimension(inst->type_id());

  assert(0);
  return 0;
}